

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::serialize
          (StateRecorder *this,uint8_t **serialized_data,size_t *serialized_size)

{
  _Hash_node_base *p_Var1;
  VkRenderPassCreateInfo2 *pass;
  bool bVar2;
  bool bVar3;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc;
  Impl *pIVar4;
  uint8_t *__dest;
  Ch *__src;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar5;
  __node_base *p_Var6;
  __node_base *p_Var7;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  __node_base *p_Var8;
  __node_base *p_Var9;
  __node_base *p_Var10;
  __node_base *p_Var11;
  __node_base *p_Var12;
  __node_base *p_Var13;
  Value value;
  Value compute_pipelines;
  Value render_passes2;
  Value render_passes;
  SubpassMeta subpass_meta;
  Value pdf_info;
  Value app_info;
  Value raytracing_pipelines;
  Value shader_modules;
  Value graphics_pipelines;
  Value pipeline_layouts;
  Value set_layouts;
  Value samplers;
  Document doc;
  Data local_2a8;
  char *local_298;
  SizeType SStack_290;
  undefined4 uStack_28c;
  char *local_288;
  SizeType SStack_280;
  undefined4 uStack_27c;
  char *local_278;
  SizeType SStack_270;
  undefined4 uStack_26c;
  Number local_268;
  Ch *pCStack_260;
  long local_258;
  long lStack_250;
  undefined8 local_248;
  undefined8 local_240;
  Data local_238;
  Data local_228;
  size_t *local_218;
  uint8_t **local_210;
  Data local_208;
  Data local_1f8;
  undefined1 local_1e0 [32];
  char *pcStack_1c0;
  char *local_1b8;
  size_t local_1b0;
  int local_1a8;
  undefined2 local_1a4;
  undefined8 local_1a0;
  Data local_198;
  Data local_188;
  Data local_178;
  Data local_168;
  Data local_158 [6];
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  if (this->impl->database_iface != (DatabaseInterface *)0x0) {
    return false;
  }
  Impl::sync_thread(this->impl);
  pMVar5 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)&local_158[0].s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  local_158[0].n = (Number)0x0;
  local_158[0].s.str = (Ch *)0x3000000000000;
  alloc = rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::GetAllocator((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                          *)&local_158[0].s);
  local_40.s = "version";
  local_40.length = 7;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  AddMember<Fossilize::__2>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&local_158[0].s,&local_40,(anon_enum_32)alloc,pMVar5);
  local_228.n = (Number)0x0;
  local_228.s.str = (Ch *)0x3000000000000;
  local_238.n = (Number)0x0;
  local_238.s.str = (Ch *)0x3000000000000;
  local_2a8.n = (Number)0x0;
  local_2a8.s.str = (Ch *)0x0;
  pIVar4 = this->impl;
  if (pIVar4->application_info != (VkApplicationInfo *)0x0) {
    serialize_application_info_inline<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((Value *)&local_228.s,pIVar4->application_info,alloc);
    pIVar4 = this->impl;
  }
  if ((pIVar4->physical_device_features == (VkPhysicalDeviceFeatures2 *)0x0) ||
     (bVar2 = serialize_physical_device_features_inline<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((Value *)&local_238.s,pIVar4->physical_device_features,alloc), bVar2)) {
    local_50.s = "applicationInfo";
    local_50.length = 0xf;
    local_218 = serialized_size;
    local_210 = serialized_data;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158[0].s,&local_50,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_228.s,alloc);
    local_60.s = "physicalDeviceFeatures";
    local_60.length = 0x16;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158[0].s,&local_60,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_238.s,alloc);
    local_168.n.i64 = (Number)0x0;
    local_168.s.str = (Ch *)0x3000000000000;
    p_Var9 = &(this->impl->samplers)._M_h._M_before_begin;
    while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (*(VkSamplerCreateInfo **)
                          &((_Prime_rehash_policy *)(p_Var9 + 2))->_M_max_load_factor,alloc,
                         (Value *)&local_2a8.s);
      if (!bVar2) goto LAB_0011c11e;
      uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((Fossilize *)local_1e0,(uint64_t)p_Var9[1]._M_nxt,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_168.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_1e0,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_2a8.s,alloc);
    }
    local_70.s = "samplers";
    local_70.length = 8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158[0].s,&local_70,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_168.s,alloc);
    local_178.n.i64 = (Number)0x0;
    local_178.s.str = (Ch *)0x3000000000000;
    p_Var10 = &(this->impl->descriptor_sets)._M_h._M_before_begin;
    while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (*(VkDescriptorSetLayoutCreateInfo **)
                          &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor,alloc,
                         (Value *)&local_2a8.s);
      if (!bVar2) goto LAB_0011c11e;
      uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((Fossilize *)local_1e0,(uint64_t)p_Var10[1]._M_nxt,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_178.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_1e0,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_2a8.s,alloc);
    }
    local_80.s = "setLayouts";
    local_80.length = 10;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158[0].s,&local_80,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_178.s,alloc);
    local_188.n.i64 = (Number)0x0;
    local_188.s.str = (Ch *)0x3000000000000;
    p_Var11 = &(this->impl->pipeline_layouts)._M_h._M_before_begin;
    while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
      json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                (*(VkPipelineLayoutCreateInfo **)
                  &((_Prime_rehash_policy *)(p_Var11 + 2))->_M_max_load_factor,alloc,
                 (Value *)&local_2a8.s);
      uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((Fossilize *)local_1e0,(uint64_t)p_Var11[1]._M_nxt,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_188.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_1e0,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_2a8.s,alloc);
    }
    local_90.s = "pipelineLayouts";
    local_90.length = 0xf;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158[0].s,&local_90,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_188.s,alloc);
    local_1f8.n.i64 = (Number)0x0;
    local_1f8.s.str = (Ch *)0x3000000000000;
    p_Var13 = &(this->impl->shader_modules)._M_h._M_before_begin;
    while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
      p_Var1 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var13 + 2))->_M_max_load_factor;
      local_268.i64 = 0;
      pCStack_260 = (Ch *)0x3000000000000;
      local_278 = "flags";
      SStack_270 = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_268.i,(StringRefType *)&local_278,*(uint *)&p_Var1[2]._M_nxt,alloc);
      local_288 = "codeSize";
      SStack_280 = 8;
      pMVar5 = alloc;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_long>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_268.i,(StringRefType *)&local_288,(unsigned_long)p_Var1[3]._M_nxt,alloc);
      local_298 = "code";
      SStack_290 = 4;
      encode_base64_abi_cxx11_
                ((string *)local_1e0,(Fossilize *)p_Var1[4]._M_nxt,p_Var1[3]._M_nxt,(size_t)pMVar5);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      AddMember<std::__cxx11::string>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&local_268.i,(StringRefType *)&local_298,(string *)local_1e0,alloc);
      std::__cxx11::string::_M_dispose();
      local_2a8.n = local_268;
      local_2a8.s.str = pCStack_260;
      uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((Fossilize *)local_1e0,(uint64_t)p_Var13[1]._M_nxt,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1f8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_1e0,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_2a8.s,alloc);
    }
    local_a0.s = "shaderModules";
    local_a0.length = 0xd;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158[0].s,&local_a0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_1f8.s,alloc);
    local_278 = (char *)0x0;
    _SStack_270 = (Ch *)0x3000000000000;
    local_288 = (char *)0x0;
    _SStack_280 = (Ch *)0x3000000000000;
    p_Var8 = &(this->impl->render_passes)._M_h._M_before_begin;
    while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
      pass = *(VkRenderPassCreateInfo2 **)
              &((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor;
      if (pass->sType == VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2) {
        bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pass,alloc,(Value *)&local_2a8.s);
        if (!bVar2) goto LAB_0011c11e;
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)local_1e0,(uint64_t)p_Var8[1]._M_nxt,alloc);
        this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_288;
      }
      else {
        if ((pass->sType != VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO) ||
           (bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              ((VkRenderPassCreateInfo *)pass,alloc,(Value *)&local_2a8.s), !bVar2))
        goto LAB_0011c11e;
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)local_1e0,(uint64_t)p_Var8[1]._M_nxt,alloc);
        this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_278;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(this_00,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_1e0,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_2a8.s,alloc);
    }
    local_b0.s = "renderPasses";
    local_b0.length = 0xc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158[0].s,&local_b0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_278,alloc);
    local_c0.s = "renderPasses2";
    local_c0.length = 0xd;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158[0].s,&local_c0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_288,alloc);
    local_298 = (char *)0x0;
    _SStack_290 = (Ch *)0x3000000000000;
    p_Var12 = &(this->impl->compute_pipelines)._M_h._M_before_begin;
    while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (*(VkComputePipelineCreateInfo **)
                          &((_Prime_rehash_policy *)(p_Var12 + 2))->_M_max_load_factor,alloc,
                         (Value *)&local_2a8.s);
      if (!bVar2) goto LAB_0011c11e;
      uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((Fossilize *)local_1e0,(uint64_t)p_Var12[1]._M_nxt,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_298,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_1e0,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_2a8.s,alloc);
    }
    local_d0.s = "computePipelines";
    local_d0.length = 0x10;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158[0].s,&local_d0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_298,alloc);
    local_198.n.i64 = (Number)0x0;
    local_198.s.str = (Ch *)0x3000000000000;
    p_Var7 = &(this->impl->graphics_pipelines)._M_h._M_before_begin;
    while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
      local_268.u64 = local_268.u64 & 0xffffffffffff0000;
      bVar2 = Impl::get_subpass_meta_for_pipeline
                        (this->impl,
                         *(VkGraphicsPipelineCreateInfo **)
                          &((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor,
                         (Hash)(*(VkGraphicsPipelineCreateInfo **)
                                 &((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor)->
                               renderPass,(SubpassMeta *)&local_268.i);
      if ((!bVar2) ||
         (bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            (*(VkGraphicsPipelineCreateInfo **)
                              &((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor,
                             (SubpassMeta *)&local_268.i,alloc,(Value *)&local_2a8.s), !bVar2))
      goto LAB_0011c11e;
      uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((Fossilize *)local_1e0,(uint64_t)p_Var7[1]._M_nxt,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_198.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_1e0,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_2a8.s,alloc);
    }
    local_e0.s = "graphicsPipelines";
    local_e0.length = 0x11;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158[0].s,&local_e0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_198.s,alloc);
    local_208.n.i64 = (Number)0x0;
    local_208.s.str = (Ch *)0x3000000000000;
    p_Var6 = &(this->impl->raytracing_pipelines)._M_h._M_before_begin;
    while( true ) {
      p_Var6 = p_Var6->_M_nxt;
      bVar2 = p_Var6 == (__node_base *)0x0;
      if (bVar2) break;
      bVar3 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (*(VkRayTracingPipelineCreateInfoKHR **)
                          &((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor,alloc,
                         (Value *)&local_2a8.s);
      if (!bVar3) goto LAB_0011c120;
      uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((Fossilize *)local_1e0,(uint64_t)p_Var6[1]._M_nxt,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_208.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_1e0,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_2a8.s,alloc);
    }
    local_f0.s = "raytracingPipelines";
    local_f0.length = 0x13;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158[0].s,&local_f0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_208.s,alloc);
    local_258 = 0;
    lStack_250 = 0;
    local_268.i64 = 0;
    pCStack_260 = (Ch *)0x0;
    local_248 = 0;
    local_240 = 0x100;
    local_1e0._8_8_ = (CrtAllocator *)0x0;
    local_1e0._16_8_ = 0;
    local_1e0._24_8_ = 0;
    pcStack_1c0 = (char *)0x0;
    local_1b8 = (char *)0x0;
    local_1b0 = 0x200;
    local_1a8 = 0x144;
    local_1a4._0_1_ = false;
    local_1a4._1_1_ = 0x20;
    local_1a0._0_4_ = 4;
    local_1a0._4_4_ = kFormatDefault;
    local_1e0._0_8_ = &local_268;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    Accept<rapidjson::PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)&local_158[0].s,
               (PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                *)local_1e0);
    *local_218 = lStack_250 - local_258;
    __dest = (uint8_t *)operator_new__(lStack_250 - local_258);
    *local_210 = __dest;
    __src = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            GetString((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      &local_268.i);
    memcpy(__dest,__src,lStack_250 - local_258);
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
              ((Stack<rapidjson::CrtAllocator> *)(local_1e0 + 8));
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
              ((Stack<rapidjson::CrtAllocator> *)&local_268.i);
  }
  else {
LAB_0011c11e:
    bVar2 = false;
  }
LAB_0011c120:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)&local_158[0].s);
  return bVar2;
}

Assistant:

bool StateRecorder::serialize(uint8_t **serialized_data, size_t *serialized_size)
{
	if (impl->database_iface)
		return false;

	impl->sync_thread();

	Document doc;
	doc.SetObject();
	auto &alloc = doc.GetAllocator();

	doc.AddMember("version", FOSSILIZE_FORMAT_VERSION, alloc);

	Value app_info(kObjectType);
	Value pdf_info(kObjectType);
	Value value;

	if (impl->application_info)
		serialize_application_info_inline(app_info, *impl->application_info, alloc);
	if (impl->physical_device_features)
		if (!serialize_physical_device_features_inline(pdf_info, *impl->physical_device_features, alloc))
			return false;

	doc.AddMember("applicationInfo", app_info, alloc);
	doc.AddMember("physicalDeviceFeatures", pdf_info, alloc);

	Value samplers(kObjectType);
	for (auto &sampler : impl->samplers)
	{
		if (!json_value(*sampler.second, alloc, &value))
			return false;
		samplers.AddMember(uint64_string(sampler.first, alloc), value, alloc);
	}
	doc.AddMember("samplers", samplers, alloc);

	Value set_layouts(kObjectType);
	for (auto &layout : impl->descriptor_sets)
	{
		if (!json_value(*layout.second, alloc, &value))
			return false;
		set_layouts.AddMember(uint64_string(layout.first, alloc), value, alloc);
	}
	doc.AddMember("setLayouts", set_layouts, alloc);

	Value pipeline_layouts(kObjectType);
	for (auto &layout : impl->pipeline_layouts)
	{
		if (!json_value(*layout.second, alloc, &value))
			return false;
		pipeline_layouts.AddMember(uint64_string(layout.first, alloc), value, alloc);
	}
	doc.AddMember("pipelineLayouts", pipeline_layouts, alloc);

	Value shader_modules(kObjectType);
	for (auto &module : impl->shader_modules)
	{
		if (!json_value(*module.second, alloc, &value))
			return false;
		shader_modules.AddMember(uint64_string(module.first, alloc), value, alloc);
	}
	doc.AddMember("shaderModules", shader_modules, alloc);

	Value render_passes(kObjectType);
	Value render_passes2(kObjectType);
	for (auto &pass : impl->render_passes)
	{
		switch (static_cast<VkBaseInStructure *>(pass.second)->sType)
		{
		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO:
			if (!json_value(*static_cast<VkRenderPassCreateInfo *>(pass.second), alloc, &value))
				return false;
			render_passes.AddMember(uint64_string(pass.first, alloc), value, alloc);
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2:
			if (!json_value(*static_cast<VkRenderPassCreateInfo2 *>(pass.second), alloc, &value))
				return false;
			render_passes2.AddMember(uint64_string(pass.first, alloc), value, alloc);
			break;

		default:
			return false;
		}
	}
	doc.AddMember("renderPasses", render_passes, alloc);
	doc.AddMember("renderPasses2", render_passes2, alloc);

	Value compute_pipelines(kObjectType);
	for (auto &pipe : impl->compute_pipelines)
	{
		if (!json_value(*pipe.second, alloc, &value))
			return false;
		compute_pipelines.AddMember(uint64_string(pipe.first, alloc), value, alloc);
	}
	doc.AddMember("computePipelines", compute_pipelines, alloc);

	Value graphics_pipelines(kObjectType);
	for (auto &pipe : impl->graphics_pipelines)
	{
		SubpassMeta subpass_meta = {};
		if (!impl->get_subpass_meta_for_pipeline(*pipe.second, api_object_cast<Hash>(pipe.second->renderPass),
		                                         &subpass_meta))
			return false;
		if (!json_value(*pipe.second, subpass_meta, alloc, &value))
			return false;
		graphics_pipelines.AddMember(uint64_string(pipe.first, alloc), value, alloc);
	}
	doc.AddMember("graphicsPipelines", graphics_pipelines, alloc);

	Value raytracing_pipelines(kObjectType);
	for (auto &pipe : impl->raytracing_pipelines)
	{
		if (!json_value(*pipe.second, alloc, &value))
			return false;
		raytracing_pipelines.AddMember(uint64_string(pipe.first, alloc), value, alloc);
	}
	doc.AddMember("raytracingPipelines", raytracing_pipelines, alloc);

	StringBuffer buffer;
	PrettyWriter<StringBuffer> writer(buffer);
	doc.Accept(writer);

	*serialized_size = buffer.GetSize();
	*serialized_data = new uint8_t[buffer.GetSize()];
	if (*serialized_data)
	{
		memcpy(*serialized_data, buffer.GetString(), buffer.GetSize());
		return true;
	}
	else
		return false;
}